

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O1

AssertionResult * __thiscall
iuutil::
CmpHelperEqIterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
          (AssertionResult *__return_storage_ptr__,iuutil *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> b1,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> e1,
          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> b2,
          __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> e2)

{
  pointer pcVar1;
  iuStreamMessage *piVar2;
  AssertionResult *pAVar3;
  bool bVar4;
  int iVar5;
  AssertionResult *pAVar6;
  bool bVar7;
  Message ar;
  int local_3ac;
  AssertionResult *local_3a8;
  ios_base *local_3a0;
  iuutil *local_398;
  int *local_390;
  AssertionResult local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [32];
  bool local_320;
  ios_base local_2c0 [264];
  undefined1 local_1b8 [392];
  
  local_3ac = 0;
  local_3a8 = __return_storage_ptr__;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  local_3ac = 0;
  bVar7 = this != (iuutil *)b1._M_current;
  bVar4 = true;
  local_398 = (iuutil *)b1._M_current;
  local_390 = (int *)b2._M_current;
  if (e1._M_current != (int *)b2._M_current && bVar7) {
    local_3a0 = local_2c0;
    bVar4 = true;
    do {
      iutest::internal::CmpHelperEQ<int,char>
                (&local_388,(internal *)0x17017c,"",(char *)this,e1._M_current,e2._M_current);
      iutest::AssertionResult::operator!((AssertionResult *)local_340,&local_388);
      bVar7 = local_320;
      if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
        operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_message._M_dataplus._M_p != &local_388.m_message.field_2) {
        operator_delete(local_388.m_message._M_dataplus._M_p,
                        local_388.m_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar7 != false) {
        piVar2 = iutest::detail::iuStreamMessage::operator<<
                           ((iuStreamMessage *)local_1b8,(char (*) [25])"\nMismatch in a position ")
        ;
        piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_3ac);
        piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [3])0x16ddda);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        std::ostream::operator<<(local_340 + 0x10,*(int *)this);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_3a0);
        piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_388.m_message);
        piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        iutest::detail::PrintToChar<signed_char>
                  ((char)*e1._M_current,(iu_ostream *)(local_340 + 0x10));
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_3a0);
        iutest::detail::iuStreamMessage::operator<<(piVar2,&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388.m_message._M_dataplus._M_p != &local_388.m_message.field_2) {
          operator_delete(local_388.m_message._M_dataplus._M_p,
                          local_388.m_message.field_2._M_allocated_capacity + 1);
        }
        bVar4 = false;
      }
      this = this + 4;
      e1._M_current = e1._M_current + 1;
      local_3ac = local_3ac + 1;
      bVar7 = this != local_398;
    } while ((bVar7) && (e1._M_current != local_390));
  }
  if (bVar7) {
    iVar5 = local_3ac;
    if (this != local_398) {
      iVar5 = local_3ac + (int)((ulong)(local_398 + (0x3fffffffc - (long)this)) >> 2) + 1;
    }
    local_340._0_4_ = iVar5;
    piVar2 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(int *)local_340);
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar2,&local_3ac);
    bVar4 = false;
  }
  if (e1._M_current != local_390) {
    local_340._0_4_ = ((int)local_390 + local_3ac) - (int)e1._M_current;
    piVar2 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,&local_3ac);
    piVar2 = iutest::detail::iuStreamMessage::operator<<(piVar2,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar2,(int *)local_340);
    bVar4 = false;
  }
  if (bVar4) {
    (local_3a8->m_message)._M_dataplus._M_p = (pointer)&(local_3a8->m_message).field_2;
    (local_3a8->m_message)._M_string_length = 0;
    (local_3a8->m_message).field_2._M_local_buf[0] = '\0';
    local_3a8->m_result = true;
    pAVar6 = local_3a8;
  }
  else {
    local_340._8_8_ = 0;
    local_340[0x10] = '\0';
    local_320 = false;
    local_340._0_8_ = local_340 + 0x10;
    pAVar3 = iutest::AssertionResult::operator<<
                       ((AssertionResult *)local_340,(iuStreamMessage *)local_1b8);
    pAVar6 = local_3a8;
    (local_3a8->m_message)._M_dataplus._M_p = (pointer)&(local_3a8->m_message).field_2;
    pcVar1 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3a8,pcVar1,pcVar1 + (pAVar3->m_message)._M_string_length);
    pAVar6->m_result = pAVar3->m_result;
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,CONCAT71(local_340._17_7_,local_340[0x10]) + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  return pAVar6;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}